

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

void ON_XMLNodePrivate::AttemptToFixTag(ON_wString *tag)

{
  bool bVar1;
  int iVar2;
  wchar_t *pwVar3;
  ON_wString local_58;
  ON_wString sProp;
  int equalSign;
  int pos;
  ON_wString local_40;
  ON_wString sNewTag;
  bool bSelfClosingTag;
  ON_wString sName;
  ON_wString *tag_local;
  
  sName.m_s = (wchar_t *)tag;
  pwVar3 = ON_wString::operator_cast_to_wchar_t_(tag);
  GetNameFromTag((ON_XMLNodePrivate *)&stack0xffffffffffffffe8,pwVar3);
  bVar1 = ON_wString::IsEmpty((ON_wString *)&stack0xffffffffffffffe8);
  if ((!bVar1) && (iVar2 = ON_wString::Length((ON_wString *)sName.m_s), 1 < iVar2)) {
    ON_wString::Right(&sNewTag,(int)sName.m_s);
    pwVar3 = ON_wString::operator_cast_to_wchar_t_(&sNewTag);
    iVar2 = wcscmp(pwVar3,L"/>");
    ON_wString::~ON_wString(&sNewTag);
    ON_wString::ON_wString((ON_wString *)&equalSign,L"<");
    ON_wString::operator+(&local_40,(ON_wString *)&equalSign);
    ON_wString::~ON_wString((ON_wString *)&equalSign);
    sProp.m_s._4_4_ = 0;
    sProp.m_s._0_4_ = -1;
    ON_wString::ON_wString(&local_58);
    while (sProp.m_s._0_4_ = ON_wString::Find((ON_wString *)sName.m_s,L'=',sProp.m_s._4_4_),
          -1 < (int)sProp.m_s) {
      sProp.m_s._4_4_ = (int)sProp.m_s + 1;
      bVar1 = RecoverProperty((ON_wString *)sName.m_s,(int)sProp.m_s,&local_58);
      if (bVar1) {
        ON_wString::operator+=(&local_40,L" ");
        ON_wString::operator+=(&local_40,&local_58);
      }
    }
    if (iVar2 == 0) {
      ON_wString::operator+=(&local_40,L"/>");
    }
    else {
      ON_wString::operator+=(&local_40,L">");
    }
    ON_wString::operator=((ON_wString *)sName.m_s,&local_40);
    ON_wString::~ON_wString(&local_58);
    ON_wString::~ON_wString(&local_40);
  }
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void ON_XMLNodePrivate::AttemptToFixTag(ON_wString& tag) // Static.
{
  // We're going to rebuild the tag from the name and the number of valid properties we find.
  const ON_wString sName = GetNameFromTag(tag);
  if (sName.IsEmpty() || tag.Length() < 2)
    return;

  const bool bSelfClosingTag = (0 == wcscmp(tag.Right(2), L"/>"));

  ON_wString sNewTag = ON_wString(L"<") + sName;

  // Now find all of the potential properties - looking for = signs.
  int pos = 0;
  int equalSign = -1;
  ON_wString sProp;

  while ((equalSign = tag.Find(L'=', pos)) >= 0)
  {
    // Move the search past this one for next time around.
    pos = equalSign + 1;

    if (RecoverProperty(tag, equalSign, sProp))
    {
      sNewTag += L" ";
      sNewTag += sProp;
    }
  }

  if (bSelfClosingTag)
  {
    sNewTag += L"/>";
  }
  else
  {
    sNewTag += L">";
  }

  tag = sNewTag;
}